

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ArrayFeatureType_EnumeratedShapes * __thiscall
CoreML::Specification::ArrayFeatureType::mutable_enumeratedshapes(ArrayFeatureType *this)

{
  bool bVar1;
  ArrayFeatureType_EnumeratedShapes *this_00;
  ArrayFeatureType *this_local;
  
  bVar1 = has_enumeratedshapes(this);
  if (!bVar1) {
    clear_ShapeFlexibility(this);
    set_has_enumeratedshapes(this);
    this_00 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    ArrayFeatureType_EnumeratedShapes::ArrayFeatureType_EnumeratedShapes(this_00);
    (this->ShapeFlexibility_).enumeratedshapes_ = this_00;
  }
  return (this->ShapeFlexibility_).enumeratedshapes_;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType_EnumeratedShapes* ArrayFeatureType::mutable_enumeratedshapes() {
  if (!has_enumeratedshapes()) {
    clear_ShapeFlexibility();
    set_has_enumeratedshapes();
    ShapeFlexibility_.enumeratedshapes_ = new ::CoreML::Specification::ArrayFeatureType_EnumeratedShapes;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ArrayFeatureType.enumeratedShapes)
  return ShapeFlexibility_.enumeratedshapes_;
}